

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_t __thiscall Pathie::Path::component_count(Path *this)

{
  bool bVar1;
  long lVar2;
  size_t pos;
  size_t result;
  Path *this_local;
  
  bVar1 = is_root(this);
  if (bVar1) {
    this_local = (Path *)0x1;
  }
  else {
    pos = 0;
    while( true ) {
      lVar2 = std::__cxx11::string::find((char *)this,0x11817c);
      if (lVar2 == -1) break;
      pos = pos + 1;
    }
    this_local = (Path *)(pos + 1);
  }
  return (size_t)this_local;
}

Assistant:

size_t Path::component_count() const
{
  if (is_root())
    return 1;

  size_t result = 0;
  size_t pos = 0;
  while ((pos = m_path.find("/", pos)) != string::npos) { // Assignment intended
    result++;
    pos++;
  }

  return ++result;
}